

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.cpp
# Opt level: O3

bool __thiscall Clasp::Lookahead::propagateFixpoint(Lookahead *this,Solver *s,PostPropagator *ctx)

{
  size_type sVar1;
  pointer pLVar2;
  bool bVar3;
  uint32 uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (((((this->nodes_).ebo_.buf)->next != 0) && (this->top_ != (s->assign_).trail.ebo_.size)) ||
     (bVar3 = true, (this->score).deps.ebo_.size == 0)) {
    do {
      sVar1 = (s->levels_).super_type.ebo_.size;
      bVar3 = propagateLevel(this,s);
      if (bVar3) {
        bVar7 = (this->score).limit != 0;
        goto LAB_0018eb26;
      }
      bVar7 = Solver::resolveConflict(s);
    } while ((bVar7) && (bVar7 = Solver::propagateUntil(s,&this->super_PostPropagator), bVar7));
    uVar5 = (ulong)(this->score).deps.ebo_.size;
    if (uVar5 != 0) {
      uVar6 = 0;
      do {
        (this->score).score.ebo_.buf[(this->score).deps.ebo_.buf[uVar6]] = (VarScore)0x0;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    (this->score).deps.ebo_.size = 0;
    (this->score).best = 0;
    (this->score).limit = 0xffffffff;
    bVar7 = true;
LAB_0018eb26:
    if ((bVar3 && sVar1 == 0) && (bVar7)) {
      this->top_ = (s->assign_).trail.ebo_.size;
      pLVar2 = (this->imps_).ebo_.buf;
      (this->imps_).ebo_.buf = (pointer)0x0;
      (this->imps_).ebo_.size = 0;
      (this->imps_).ebo_.cap = 0;
      if (pLVar2 != (pointer)0x0) {
        operator_delete(pLVar2);
      }
    }
    if (((ctx == (PostPropagator *)0x0) && (this->limit_ != 0)) &&
       (uVar4 = this->limit_ - 1, this->limit_ = uVar4, uVar4 == 0)) {
      (*(this->super_PostPropagator).super_Constraint._vptr_Constraint[5])(this,s,1);
    }
  }
  return bVar3;
}

Assistant:

bool Lookahead::propagateFixpoint(Solver& s, PostPropagator* ctx) {
	if ((empty() || top_ == s.numAssignedVars()) && !score.deps.empty()) {
		// nothing to lookahead
		return true;
	}
	bool ok = true;
	uint32 dl;
	for (dl = s.decisionLevel(); !propagateLevel(s); dl = s.decisionLevel()) {
		// some literal failed
		// resolve and propagate conflict
		assert(s.decisionLevel() >= dl);
		if (!s.resolveConflict() || !s.propagateUntil(this)) {
			ok = false;
			score.clearDeps();
			break;
		}
	}
	if (ok && dl == 0 && score.limit > 0) {
		// remember top-level size - no need to redo lookahead
		// on level 0 unless we learn a new implication
		assert(s.queueSize() == 0);
		top_ = s.numAssignedVars();
		LitVec().swap(imps_);
	}
	if (!ctx && limit_ && --limit_ == 0) {
		this->destroy(&s, true);
	}
	return ok;
}